

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<char_const*,std::allocator<char_const*>> *this_00;
  iterator __position;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  cmsysProcess *cp;
  long *plVar6;
  char *pcVar7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  cmMakefile *this_01;
  long lVar14;
  int length;
  vector<char,_std::allocator<char>_> tempOutput;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  string error_variable;
  string output_variable;
  string output_file;
  char *data;
  double timeout;
  string result_variable;
  vector<char,_std::allocator<char>_> tempError;
  string working_directory;
  string error_file;
  string input_file;
  string timeout_string;
  ostringstream e;
  string arguments;
  int local_35c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  local_338;
  string local_318;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  undefined8 local_2b8;
  undefined8 local_2b0;
  ulong local_2a8;
  ulong local_2a0;
  char *local_298;
  double local_290;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  char *local_248;
  long local_240;
  char local_238;
  undefined7 uStack_237;
  char *local_228;
  size_t local_220;
  char local_218;
  undefined7 uStack_217;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8;
  undefined7 uStack_1d7;
  undefined1 local_1c8 [8];
  pointer ppcStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [6];
  ios_base local_158 [264];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar12) {
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
    return false;
  }
  local_338.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar10 = 0;
  local_338.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_1e8 = &local_1d8;
  local_1e0 = 0;
  local_1d8 = 0;
  local_208 = &local_1f8;
  local_200 = 0;
  local_1f8 = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_228 = &local_218;
  local_220 = 0;
  local_218 = '\0';
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  local_2f8._M_string_length = 0;
  local_2f8.field_2._M_local_buf[0] = '\0';
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_318._M_string_length = 0;
  local_318.field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_248 = &local_238;
  local_240 = 0;
  local_238 = '\0';
  local_2b8 = 0;
  local_2b0 = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  lVar14 = 0;
  bVar2 = false;
  do {
    iVar3 = std::__cxx11::string::compare((char *)(pbVar12 + uVar10));
    if (iVar3 == 0) {
      lVar14 = (long)local_338.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_338.
                     super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      local_1c8 = (undefined1  [8])0x0;
      ppcStack_1c0 = (pointer)0x0;
      local_1b8[0]._M_allocated_capacity = (pointer)0x0;
      std::
      vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
      ::emplace_back<std::vector<char_const*,std::allocator<char_const*>>>
                ((vector<std::vector<char_const*,std::allocator<char_const*>>,std::allocator<std::vector<char_const*,std::allocator<char_const*>>>>
                  *)&local_338,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_1c8);
      if (local_1c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity - (long)local_1c8);
      }
      lVar14 = (lVar14 >> 3) * -0x5555555555555555;
LAB_0026eb36:
      bVar2 = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar10));
      if (iVar3 == 0) {
        uVar10 = uVar10 + 1;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
          local_1c8 = (undefined1  [8])local_1b8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c8," called with no value for OUTPUT_VARIABLE.","");
          cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
          goto LAB_0026f5bf;
        }
        std::__cxx11::string::_M_assign((string *)&local_2f8);
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar10));
        if (iVar3 == 0) {
          uVar10 = uVar10 + 1;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
            local_1c8 = (undefined1  [8])local_1b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1c8," called with no value for ERROR_VARIABLE.","");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
            goto LAB_0026f5bf;
          }
          std::__cxx11::string::_M_assign((string *)&local_318);
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar10));
          if (iVar3 == 0) {
            uVar10 = uVar10 + 1;
            if ((ulong)((long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
              local_1c8 = (undefined1  [8])local_1b8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1c8," called with no value for RESULT_VARIABLE.","");
              cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
              goto LAB_0026f5bf;
            }
            std::__cxx11::string::_M_assign((string *)&local_288);
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar10));
            if (iVar3 == 0) {
              uVar10 = uVar10 + 1;
              if ((ulong)((long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
                local_1c8 = (undefined1  [8])local_1b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c8," called with no value for WORKING_DIRECTORY.","");
                cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
                goto LAB_0026f5bf;
              }
              std::__cxx11::string::_M_assign((string *)&local_248);
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar10));
              if (iVar3 == 0) {
                uVar10 = uVar10 + 1;
                if ((ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
                  local_1c8 = (undefined1  [8])local_1b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1c8," called with no value for INPUT_FILE.","");
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
                  goto LAB_0026f5bf;
                }
                std::__cxx11::string::_M_assign((string *)&local_208);
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + uVar10));
                if (iVar3 == 0) {
                  uVar10 = uVar10 + 1;
                  if ((ulong)((long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
                    local_1c8 = (undefined1  [8])local_1b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_1c8," called with no value for OUTPUT_FILE.","");
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
                    goto LAB_0026f5bf;
                  }
                  std::__cxx11::string::_M_assign((string *)&local_2d8);
                }
                else {
                  iVar3 = std::__cxx11::string::compare
                                    ((char *)((args->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + uVar10));
                  if (iVar3 == 0) {
                    uVar10 = uVar10 + 1;
                    if ((ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10) {
                      local_1c8 = (undefined1  [8])local_1b8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_1c8," called with no value for ERROR_FILE.","");
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
                      goto LAB_0026f5bf;
                    }
                    std::__cxx11::string::_M_assign((string *)&local_228);
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare
                                      ((char *)((args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start + uVar10)
                                      );
                    if (iVar3 == 0) {
                      uVar10 = uVar10 + 1;
                      if ((ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar10)
                      {
                        local_1c8 = (undefined1  [8])local_1b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_1c8," called with no value for TIMEOUT.","");
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
                        goto LAB_0026f5bf;
                      }
                      std::__cxx11::string::_M_assign((string *)&local_1e8);
                    }
                    else {
                      uVar5 = std::__cxx11::string::compare
                                        ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                 uVar10));
                      if ((int)uVar5 == 0) {
                        local_2a0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                      }
                      else {
                        uVar5 = std::__cxx11::string::compare
                                          ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10));
                        if ((int)uVar5 == 0) {
                          local_2a8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                        }
                        else {
                          uVar5 = std::__cxx11::string::compare
                                            ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10));
                          if ((int)uVar5 == 0) {
                            local_2b0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                          }
                          else {
                            uVar5 = std::__cxx11::string::compare
                                              ((char *)((args->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar10));
                            if ((int)uVar5 != 0) {
                              if (bVar2) {
                                local_1c8 = (undefined1  [8])
                                            (args->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start[uVar10].
                                            _M_dataplus._M_p;
                                std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                          (local_338.
                                           super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar14,
                                           (value_type *)local_1c8);
                                goto LAB_0026eb36;
                              }
                              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8)
                              ;
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1c8," given unknown argument \"",0x19);
                              pbVar12 = (args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start;
                              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                                 ((ostream *)local_1c8,
                                                  pbVar12[uVar10]._M_dataplus._M_p,
                                                  pbVar12[uVar10]._M_string_length);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
                              std::__cxx11::stringbuf::str();
                              cmCommand::SetError(&this->super_cmCommand,&local_358);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                                operator_delete(local_358._M_dataplus._M_p,
                                                local_358.field_2._M_allocated_capacity + 1);
                              }
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)local_1c8);
                              std::ios_base::~ios_base(local_158);
                              goto LAB_0026f5dc;
                            }
                            local_2b8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      bVar2 = false;
    }
    uVar10 = uVar10 + 1;
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  } while (uVar10 < (ulong)((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5))
  ;
  bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,local_2d8._M_dataplus._M_p)
  ;
  if (!bVar2) {
    std::operator+(&local_358,"attempted to output into a file: ",&local_2d8);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_358);
    local_1c8 = (undefined1  [8])local_1b8;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar9) {
      local_1b8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1b8[0]._8_8_ = plVar6[3];
    }
    else {
      local_1b8[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_1c8 = (undefined1  [8])*plVar6;
    }
    ppcStack_1c0 = (pointer)plVar6[1];
    *plVar6 = (long)paVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
    cmSystemTools::s_FatalErrorOccured = true;
LAB_0026f5bf:
    if (local_1c8 != (undefined1  [8])local_1b8) {
      operator_delete((void *)local_1c8,local_1b8[0]._M_allocated_capacity + 1);
    }
LAB_0026f5dc:
    bVar2 = false;
    goto LAB_0026f5de;
  }
  if (local_338.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_338.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8," called with no COMMAND argument.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
    goto LAB_0026f5bf;
  }
  uVar10 = 0;
  uVar11 = 1;
  do {
    if (local_338.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar10].
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_338.
        super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar10].
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_1c8 = (undefined1  [8])local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8," given COMMAND argument with no value.","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
      goto LAB_0026f5bf;
    }
    this_00 = (vector<char_const*,std::allocator<char_const*>> *)
              (local_338.
               super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar10);
    local_1c8 = (undefined1  [8])0x0;
    __position._M_current = *(char ***)(this_00 + 8);
    if (__position._M_current == *(char ***)(this_00 + 0x10)) {
      std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                (this_00,__position,(char **)local_1c8);
    }
    else {
      *__position._M_current = (char *)0x0;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    uVar10 = ((long)local_338.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_338.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    bVar2 = uVar11 <= uVar10;
    lVar14 = uVar10 - uVar11;
    uVar10 = uVar11;
    uVar11 = (ulong)((int)uVar11 + 1);
  } while (bVar2 && lVar14 != 0);
  local_290 = -1.0;
  if ((local_1e0 != 0) && (iVar3 = __isoc99_sscanf(local_1e8,"%lg",&local_290), iVar3 != 1)) {
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8," called with TIMEOUT value that could not be parsed.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1c8);
    goto LAB_0026f5bf;
  }
  cp = cmsysProcess_New();
  if (local_338.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_338.
      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar11 = 1;
    do {
      cmsysProcess_AddCommand
                (cp,local_338.
                    super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
      uVar10 = ((long)local_338.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_338.
                      super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar2 = uVar11 <= uVar10;
      lVar14 = uVar10 - uVar11;
      uVar10 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar2 && lVar14 != 0);
  }
  if (local_240 != 0) {
    cmsysProcess_SetWorkingDirectory(cp,local_248);
  }
  cmsysProcess_SetOption(cp,0,1);
  if (local_200 != 0) {
    cmsysProcess_SetPipeFile(cp,1,local_208);
  }
  if (local_2d8._M_string_length != 0) {
    cmsysProcess_SetPipeFile(cp,2,local_2d8._M_dataplus._M_p);
  }
  pcVar7 = local_228;
  if (local_220 == 0) {
LAB_0026ef1c:
    bVar2 = false;
    bVar1 = false;
    if ((local_2f8._M_string_length != 0) &&
       (bVar1 = false, local_2f8._M_string_length == local_318._M_string_length)) {
LAB_0026ef37:
      iVar3 = bcmp(local_2f8._M_dataplus._M_p,local_318._M_dataplus._M_p,local_2f8._M_string_length)
      ;
      if ((bVar2) || (iVar3 == 0)) goto LAB_0026f2f4;
      bVar1 = false;
    }
  }
  else {
    if ((local_220 != local_2d8._M_string_length) ||
       (iVar3 = bcmp(local_228,local_2d8._M_dataplus._M_p,local_220), iVar3 != 0)) {
      cmsysProcess_SetPipeFile(cp,3,pcVar7);
      goto LAB_0026ef1c;
    }
    if ((local_2f8._M_string_length != 0) &&
       (bVar2 = true, local_2f8._M_string_length == local_318._M_string_length)) goto LAB_0026ef37;
LAB_0026f2f4:
    bVar1 = true;
    cmsysProcess_SetOption(cp,2,1);
  }
  if (0.0 <= local_290) {
    cmsysProcess_SetTimeout(cp,local_290);
  }
  cmsysProcess_Execute(cp);
  local_358._M_dataplus._M_p = (char *)0x0;
  local_358._M_string_length = 0;
  local_358.field_2._M_allocated_capacity = 0;
  local_268.field_2._M_allocated_capacity = 0;
  local_268._M_dataplus._M_p = (char *)0x0;
  local_268._M_string_length = 0;
LAB_0026f361:
  do {
    while (iVar3 = cmsysProcess_WaitForData(cp,&local_298,&local_35c,(double *)0x0), iVar3 == 2) {
      if ((local_2a0 & 1) == 0) {
        pbVar13 = &local_358;
        if (local_2f8._M_string_length == 0) {
          cmSystemTools::Stdout(local_298,(long)local_35c);
        }
        else {
LAB_0026f3c5:
          std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
                    ((vector<char,std::allocator<char>> *)pbVar13,pbVar13->_M_string_length);
        }
      }
    }
    if (iVar3 == 3) {
      if ((local_2a8 & 1) == 0) {
        pbVar13 = &local_268;
        if (local_318._M_string_length != 0) goto LAB_0026f3c5;
        cmSystemTools::Stderr(local_298,(long)local_35c);
      }
      goto LAB_0026f361;
    }
  } while (iVar3 != 0);
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  cmExecuteProcessCommandFixText
            ((vector<char,_std::allocator<char>_> *)&local_358,(bool)((byte)local_2b0 & 1));
  cmExecuteProcessCommandFixText
            ((vector<char,_std::allocator<char>_> *)&local_268,(bool)((byte)local_2b8 & 1));
  if ((local_2f8._M_string_length != 0) &&
     (local_358._M_dataplus._M_p != (pointer)local_358._M_string_length)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_2f8,local_358._M_dataplus._M_p);
  }
  if ((!bVar1 && local_318._M_string_length != 0) &&
     (local_268._M_dataplus._M_p != (pointer)local_268._M_string_length)) {
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_318,local_268._M_dataplus._M_p);
  }
  if (local_288._M_string_length == 0) goto switchD_0026f4b5_caseD_3;
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    this_01 = (this->super_cmCommand).Makefile;
    pcVar7 = cmsysProcess_GetErrorString(cp);
    goto LAB_0026f516;
  case 2:
    this_01 = (this->super_cmCommand).Makefile;
    pcVar7 = cmsysProcess_GetExceptionString(cp);
LAB_0026f516:
    cmMakefile::AddDefinition(this_01,&local_288,pcVar7);
    break;
  case 4:
    uVar4 = cmsysProcess_GetExitValue(cp);
    sprintf(local_1c8,"%d",(ulong)uVar4);
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_288,local_1c8);
    break;
  case 5:
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,&local_288,"Process terminated due to timeout");
  }
switchD_0026f4b5_caseD_3:
  cmsysProcess_Delete(cp);
  if (local_268._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_268._M_dataplus._M_p,
                    local_268.field_2._M_allocated_capacity - (long)local_268._M_dataplus._M_p);
  }
  if (local_358._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_358._M_dataplus._M_p,
                    local_358.field_2._M_allocated_capacity - (long)local_358._M_dataplus._M_p);
  }
  bVar2 = true;
LAB_0026f5de:
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,
                    CONCAT71(local_318.field_2._M_allocated_capacity._1_7_,
                             local_318.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,
                    CONCAT71(local_2f8.field_2._M_allocated_capacity._1_7_,
                             local_2f8.field_2._M_local_buf[0]) + 1);
  }
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,
                    CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                             local_2d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector(&local_338);
  return bVar2;
}

Assistant:

bool cmExecuteProcessCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector< std::vector<const char*> > cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string working_directory;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMMAND")
      {
      doing_command = true;
      command_index = cmds.size();
      cmds.push_back(std::vector<const char*>());
      }
    else if(args[i] == "OUTPUT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        result_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "WORKING_DIRECTORY")
      {
      doing_command = false;
      if(++i < args.size())
        {
        working_directory = args[i];
        }
      else
        {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
        }
      }
    else if(args[i] == "INPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        input_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
        }
      }
    else if(args[i] == "TIMEOUT")
      {
      doing_command = false;
      if(++i < args.size())
        {
        timeout_string = args[i];
        }
      else
        {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_QUIET")
      {
      doing_command = false;
      output_quiet = true;
      }
    else if(args[i] == "ERROR_QUIET")
      {
      doing_command = false;
      error_quiet = true;
      }
    else if(args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      output_strip_trailing_whitespace = true;
      }
    else if(args[i] == "ERROR_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      error_strip_trailing_whitespace = true;
      }
    else if(doing_command)
      {
      cmds[command_index].push_back(args[i].c_str());
      }
    else
      {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(output_file.c_str()) )
    {
    std::string e = "attempted to output into a file: " + output_file
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  // Check for commands given.
  if(cmds.empty())
    {
    this->SetError(" called with no COMMAND argument.");
    return false;
    }
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    if(cmds[i].empty())
      {
      this->SetError(" given COMMAND argument with no value.");
      return false;
      }
    else
      {
      // Add the null terminating pointer to the command argument list.
      cmds[i].push_back(0);
      }
    }

  // Parse the timeout string.
  double timeout = -1;
  if(!timeout_string.empty())
    {
    if(sscanf(timeout_string.c_str(), "%lg", &timeout) != 1)
      {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
      }
    }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    cmsysProcess_AddCommand(cp, &*cmds[i].begin());
    }

  // Set the process working directory.
  if(!working_directory.empty())
    {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
    }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if(!input_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
    }
  if(!output_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
    }
  if(!error_file.empty())
    {
    if (error_file == output_file)
      {
      merge_output = true;
      }
    else
      {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
      }
    }
  if (!output_variable.empty() && output_variable == error_variable)
    {
    merge_output = true;
    }
  if (merge_output)
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    }

  // Set the timeout if any.
  if(timeout >= 0)
    {
    cmsysProcess_SetTimeout(cp, timeout);
    }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  while((p = cmsysProcess_WaitForData(cp, &data, &length, 0), p))
    {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet)
      {
      if(output_variable.empty())
        {
        cmSystemTools::Stdout(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
        }
      }
    else if(p == cmsysProcess_Pipe_STDERR && !error_quiet)
      {
      if(error_variable.empty())
        {
        cmSystemTools::Stderr(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempError, data, length);
        }
      }
    }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, 0);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 error_strip_trailing_whitespace);

  // Store the output obtained.
  if(!output_variable.empty() && !tempOutput.empty())
    {
    this->Makefile->AddDefinition(output_variable,
                                  &*tempOutput.begin());
    }
  if(!merge_output && !error_variable.empty() && !tempError.empty())
    {
    this->Makefile->AddDefinition(error_variable,
                                  &*tempError.begin());
    }

  // Store the result of running the process.
  if(!result_variable.empty())
    {
    switch(cmsysProcess_GetState(cp))
      {
      case cmsysProcess_State_Exited:
        {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[100];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
        }
        break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                  "Process terminated due to timeout");
        break;
      }
    }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}